

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::rleCompress(int inLength,char *in,char *out)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *outWrite;
  char *runEnd;
  char *runStart;
  char *inEnd;
  char *out_local;
  char *in_local;
  int inLength_local;
  
  pcVar2 = in + inLength;
  runEnd = in + 1;
  outWrite = out;
  runStart = in;
  while (runStart < pcVar2) {
    while( true ) {
      bVar1 = false;
      if ((runEnd < pcVar2) && (bVar1 = false, *runStart == *runEnd)) {
        bVar1 = (long)(runEnd + (-1 - (long)runStart)) < 0x7f;
      }
      if (!bVar1) break;
      runEnd = runEnd + 1;
    }
    if ((long)runEnd - (long)runStart < 3) {
      while( true ) {
        bVar1 = false;
        if ((runEnd < pcVar2) &&
           ((((pcVar2 <= runEnd + 1 || (*runEnd != runEnd[1])) || (pcVar2 <= runEnd + 2)) ||
            (bVar1 = false, runEnd[1] != runEnd[2])))) {
          bVar1 = (long)runEnd - (long)runStart < 0x7f;
        }
        if (!bVar1) break;
        runEnd = runEnd + 1;
      }
      *outWrite = (char)runStart - (char)runEnd;
      while (outWrite = outWrite + 1, runStart < runEnd) {
        *outWrite = *runStart;
        runStart = runStart + 1;
      }
    }
    else {
      pcVar3 = outWrite + 1;
      *outWrite = ((char)runEnd - (char)runStart) + -1;
      outWrite = outWrite + 2;
      *pcVar3 = *runStart;
      runStart = runEnd;
    }
    runEnd = runEnd + 1;
  }
  return (int)outWrite - (int)out;
}

Assistant:

static int rleCompress(int inLength, const char in[], signed char out[]) {
  const char *inEnd = in + inLength;
  const char *runStart = in;
  const char *runEnd = in + 1;
  signed char *outWrite = out;

  while (runStart < inEnd) {
    while (runEnd < inEnd && *runStart == *runEnd &&
           runEnd - runStart - 1 < MAX_RUN_LENGTH) {
      ++runEnd;
    }

    if (runEnd - runStart >= MIN_RUN_LENGTH) {
      //
      // Compressible run
      //

      *outWrite++ = static_cast<char>(runEnd - runStart) - 1;
      *outWrite++ = *(reinterpret_cast<const signed char *>(runStart));
      runStart = runEnd;
    } else {
      //
      // Uncompressable run
      //

      while (runEnd < inEnd &&
             ((runEnd + 1 >= inEnd || *runEnd != *(runEnd + 1)) ||
              (runEnd + 2 >= inEnd || *(runEnd + 1) != *(runEnd + 2))) &&
             runEnd - runStart < MAX_RUN_LENGTH) {
        ++runEnd;
      }

      *outWrite++ = static_cast<char>(runStart - runEnd);

      while (runStart < runEnd) {
        *outWrite++ = *(reinterpret_cast<const signed char *>(runStart++));
      }
    }

    ++runEnd;
  }

  return static_cast<int>(outWrite - out);
}